

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  string *__lhs;
  int iVar1;
  bool bVar2;
  __type _Var3;
  AlphaNum *in_R8;
  string delimiter;
  allocator local_e1;
  string local_e0;
  string local_b0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  iVar1 = this->recursion_limit_;
  this->recursion_limit_ = iVar1 + -1;
  if (iVar1 < 1) {
    local_e0._M_dataplus._M_p =
         "Message is too deep, the parser exceeded the configured recursion limit of ";
    local_e0._M_string_length = 0x4b;
    strings::AlphaNum::AlphaNum(&local_90,this->initial_recursion_limit_);
    local_60.piece_data_ = ".";
    local_60.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_b0,(protobuf *)&local_e0,&local_90,&local_60,in_R8);
    ReportError(this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    bVar2 = false;
  }
  else {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    bVar2 = ConsumeMessageDelimiter(this,&local_e0);
    if (bVar2) {
      __lhs = &(this->tokenizer_).current_.text;
      do {
        std::__cxx11::string::string((string *)&local_90,">",(allocator *)&local_b0);
        _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&local_90);
        if (_Var3) {
          std::__cxx11::string::~string((string *)&local_90);
LAB_003b1066:
          bVar2 = Consume(this,&local_e0);
          if (bVar2) {
            this->recursion_limit_ = this->recursion_limit_ + 1;
            bVar2 = true;
            goto LAB_003b1083;
          }
          break;
        }
        std::__cxx11::string::string((string *)&local_60,"}",&local_e1);
        _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_90);
        if (_Var3) goto LAB_003b1066;
        bVar2 = SkipField(this);
      } while (bVar2);
    }
    bVar2 = false;
LAB_003b1083:
    std::__cxx11::string::~string((string *)&local_e0);
  }
  return bVar2;
}

Assistant:

bool SkipFieldMessage() {
    if (--recursion_limit_ < 0) {
      ReportError(
          StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));

    ++recursion_limit_;
    return true;
  }